

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

XMLError __thiscall tinyxml2::XMLDocument::LoadFile(XMLDocument *this,FILE *fp)

{
  int iVar1;
  size_t __n;
  char *__ptr;
  size_t sVar2;
  XMLError error;
  
  Clear(this);
  fseeko64((FILE *)fp,0,0);
  iVar1 = fgetc((FILE *)fp);
  if (iVar1 == -1) {
    iVar1 = ferror((FILE *)fp);
    if (iVar1 == 0) goto LAB_0011a7eb;
LAB_0011a866:
    error = XML_ERROR_FILE_READ_ERROR;
  }
  else {
LAB_0011a7eb:
    fseeko64((FILE *)fp,0,2);
    __n = ftello64((FILE *)fp);
    fseeko64((FILE *)fp,0,0);
    if (__n != 0) {
      if (__n != 0xffffffffffffffff) {
        __ptr = (char *)operator_new__(__n + 1);
        this->_charBuffer = __ptr;
        sVar2 = fread(__ptr,1,__n,(FILE *)fp);
        if (sVar2 == __n) {
          this->_charBuffer[__n] = '\0';
          Parse(this);
          goto LAB_0011a883;
        }
      }
      goto LAB_0011a866;
    }
    error = XML_ERROR_EMPTY_DOCUMENT;
  }
  SetError(this,error,0,(char *)0x0);
LAB_0011a883:
  return this->_errorID;
}

Assistant:

XMLError XMLDocument::LoadFile( FILE* fp )
{
    Clear();

    TIXML_FSEEK( fp, 0, SEEK_SET );
    if ( fgetc( fp ) == EOF && ferror( fp ) != 0 ) {
        SetError( XML_ERROR_FILE_READ_ERROR, 0, 0 );
        return _errorID;
    }

    TIXML_FSEEK( fp, 0, SEEK_END );

    unsigned long long filelength;
    {
        const long long fileLengthSigned = TIXML_FTELL( fp );
        TIXML_FSEEK( fp, 0, SEEK_SET );
        if ( fileLengthSigned == -1L ) {
            SetError( XML_ERROR_FILE_READ_ERROR, 0, 0 );
            return _errorID;
        }
        TIXMLASSERT( fileLengthSigned >= 0 );
        filelength = static_cast<unsigned long long>(fileLengthSigned);
    }

    const size_t maxSizeT = static_cast<size_t>(-1);
    // We'll do the comparison as an unsigned long long, because that's guaranteed to be at
    // least 8 bytes, even on a 32-bit platform.
    if ( filelength >= static_cast<unsigned long long>(maxSizeT) ) {
        // Cannot handle files which won't fit in buffer together with null terminator
        SetError( XML_ERROR_FILE_READ_ERROR, 0, 0 );
        return _errorID;
    }

    if ( filelength == 0 ) {
        SetError( XML_ERROR_EMPTY_DOCUMENT, 0, 0 );
        return _errorID;
    }

    const size_t size = static_cast<size_t>(filelength);
    TIXMLASSERT( _charBuffer == 0 );
    _charBuffer = new char[size+1];
    const size_t read = fread( _charBuffer, 1, size, fp );
    if ( read != size ) {
        SetError( XML_ERROR_FILE_READ_ERROR, 0, 0 );
        return _errorID;
    }

    _charBuffer[size] = 0;

    Parse();
    return _errorID;
}